

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::NavigationBar::showPreviousScreen(NavigationBar *this)

{
  int iVar1;
  QStackedWidget *pQVar2;
  NavigationButton *pNVar3;
  TextLabel *this_00;
  QWidget *pQVar4;
  bool bVar5;
  int iVar6;
  NavigationBarPrivate *pNVar7;
  NavigationBarPrivate *pNVar8;
  QSharedPointer<QtMWidgets::NavigationItem> *pQVar9;
  int *piVar10;
  NavigationItem *text;
  QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
  *pQVar11;
  QWidget *local_70;
  undefined1 local_68 [8];
  QSharedPointer<QtMWidgets::NavigationItem> backItem;
  QWidget *local_48;
  undefined1 local_40 [8];
  QSharedPointer<QtMWidgets::NavigationItem> currentItem;
  undefined1 local_28 [8];
  QSharedPointer<QtMWidgets::NavigationItem> prevItem;
  int prevIndex;
  NavigationBar *this_local;
  
  pNVar7 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  bVar5 = QList<int>::isEmpty(&(pNVar7->backStack).super_QList<int>);
  if (bVar5) {
    return;
  }
  pQVar11 = &this->d;
  pNVar7 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(pQVar11);
  prevItem.d._4_4_ = QStack<int>::pop(&pNVar7->backStack);
  pNVar7 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(pQVar11);
  pNVar8 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(pQVar11);
  currentItem.d = (Data *)QStackedWidget::widget((int)pNVar8->stack);
  pQVar9 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                     (&pNVar7->itemsMap,(QWidget **)&currentItem.d);
  QSharedPointer<QtMWidgets::NavigationItem>::QSharedPointer
            ((QSharedPointer<QtMWidgets::NavigationItem> *)local_28,pQVar9);
  pNVar7 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(pQVar11);
  pNVar8 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(pQVar11);
  pQVar2 = pNVar8->stack;
  currentIndex(this);
  local_48 = (QWidget *)QStackedWidget::widget((int)pQVar2);
  pQVar9 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                     (&pNVar7->itemsMap,&local_48);
  QSharedPointer<QtMWidgets::NavigationItem>::QSharedPointer
            ((QSharedPointer<QtMWidgets::NavigationItem> *)local_40,pQVar9);
  pNVar7 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  bVar5 = QList<int>::isEmpty(&(pNVar7->forwardStack).super_QList<int>);
  if (!bVar5) {
    pNVar7 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(&this->d);
    piVar10 = QStack<int>::top(&pNVar7->forwardStack);
    iVar1 = *piVar10;
    iVar6 = currentIndex(this);
    if (iVar1 == iVar6) goto LAB_001d500d;
  }
  pNVar7 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  backItem.d._0_4_ = currentIndex(this);
  QStack<int>::push(&pNVar7->forwardStack,(int *)&backItem.d);
  pNVar7 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  pNVar3 = pNVar7->right;
  QSharedPointer<QtMWidgets::NavigationItem>::operator->
            ((QSharedPointer<QtMWidgets::NavigationItem> *)local_40);
  QAbstractButton::setText((QString *)pNVar3);
  QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
  ::operator->(&this->d);
  QWidget::show();
LAB_001d500d:
  pNVar7 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  this_00 = pNVar7->title;
  text = QSharedPointer<QtMWidgets::NavigationItem>::operator->
                   ((QSharedPointer<QtMWidgets::NavigationItem> *)local_28);
  TextLabel::setText(this_00,&text->title);
  pNVar7 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  pQVar4 = (QWidget *)pNVar7->stack;
  QSharedPointer<QtMWidgets::NavigationItem>::operator->
            ((QSharedPointer<QtMWidgets::NavigationItem> *)local_28);
  QStackedWidget::setCurrentWidget(pQVar4);
  pNVar7 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  bVar5 = QList<int>::isEmpty(&(pNVar7->backStack).super_QList<int>);
  if (bVar5) {
    QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
    ::operator->(&this->d);
    QWidget::hide();
  }
  else {
    pQVar11 = &this->d;
    pNVar7 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(pQVar11);
    pNVar8 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(pQVar11);
    pQVar2 = pNVar8->stack;
    pNVar8 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(pQVar11);
    QStack<int>::top(&pNVar8->backStack);
    local_70 = (QWidget *)QStackedWidget::widget((int)pQVar2);
    pQVar9 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                       (&pNVar7->itemsMap,&local_70);
    QSharedPointer<QtMWidgets::NavigationItem>::QSharedPointer
              ((QSharedPointer<QtMWidgets::NavigationItem> *)local_68,pQVar9);
    pNVar7 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(&this->d);
    pNVar3 = pNVar7->left;
    QSharedPointer<QtMWidgets::NavigationItem>::operator->
              ((QSharedPointer<QtMWidgets::NavigationItem> *)local_68);
    QAbstractButton::setText((QString *)pNVar3);
    QSharedPointer<QtMWidgets::NavigationItem>::~QSharedPointer
              ((QSharedPointer<QtMWidgets::NavigationItem> *)local_68);
  }
  QSharedPointer<QtMWidgets::NavigationItem>::~QSharedPointer
            ((QSharedPointer<QtMWidgets::NavigationItem> *)local_40);
  QSharedPointer<QtMWidgets::NavigationItem>::~QSharedPointer
            ((QSharedPointer<QtMWidgets::NavigationItem> *)local_28);
  return;
}

Assistant:

void
NavigationBar::showPreviousScreen()
{
	if( !d->backStack.isEmpty() )
	{
		const int prevIndex = d->backStack.pop();
		QSharedPointer< NavigationItem > prevItem =
			d->itemsMap[ d->stack->widget( prevIndex ) ];
		QSharedPointer< NavigationItem > currentItem =
			d->itemsMap[ d->stack->widget( currentIndex() ) ];

		if( d->forwardStack.isEmpty() || d->forwardStack.top() != currentIndex() )
		{
			d->forwardStack.push( currentIndex() );

			d->right->setText( currentItem->title );
			d->right->show();
		}

		d->title->setText( prevItem->title );

		d->stack->setCurrentWidget( prevItem->self );

		if( !d->backStack.isEmpty() )
		{
			QSharedPointer< NavigationItem > backItem =
				d->itemsMap[ d->stack->widget( d->backStack.top() ) ];

			d->left->setText( backItem->title );
		}
		else
			d->left->hide();
	}
}